

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::find_eoi(jpeg_decoder *this)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (this->m_progressive_flag == 0) {
    this->m_bits_left = 0;
    this->m_bit_buf = this->m_bit_buf << 0x10;
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar5 = 0xd9;
      if (uVar6 == 0) {
        uVar5 = 0xff;
      }
    }
    else {
      pbVar3 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar3 + 1;
      bVar1 = *pbVar3;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar5 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar2 = this->m_tem_flag;
      this->m_tem_flag = uVar2 ^ 1;
      uVar6 = 0xd9;
      if (uVar2 == 0) {
        uVar6 = 0xff;
      }
    }
    else {
      pbVar3 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar3 + 1;
      uVar6 = (uint)*pbVar3;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    uVar6 = uVar5 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6;
    uVar4 = uVar6 << (-(char)this->m_bits_left & 0x1fU);
    this->m_bit_buf = uVar4;
    if (this->m_bits_left < 1) {
      this->m_bit_buf = uVar6 << 0x10;
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar6 = this->m_tem_flag;
        this->m_tem_flag = uVar6 ^ 1;
        uVar5 = 0xd9;
        if (uVar6 == 0) {
          uVar5 = 0xff;
        }
      }
      else {
        pbVar3 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar3 + 1;
        bVar1 = *pbVar3;
        this->m_in_buf_left = this->m_in_buf_left + -1;
        uVar5 = (uint)bVar1;
      }
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar2 = this->m_tem_flag;
        this->m_tem_flag = uVar2 ^ 1;
        uVar6 = 0xd9;
        if (uVar2 == 0) {
          uVar6 = 0xff;
        }
      }
      else {
        pbVar3 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar3 + 1;
        uVar6 = (uint)*pbVar3;
        this->m_in_buf_left = this->m_in_buf_left + -1;
      }
      this->m_bit_buf =
           (uVar5 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6) <<
           (-(char)this->m_bits_left & 0x1fU);
      this->m_bits_left = this->m_bits_left + 0x10;
    }
    else {
      this->m_bit_buf = uVar4 << 0x10;
    }
    process_markers(this);
  }
  this->m_total_bytes_read = this->m_total_bytes_read - this->m_in_buf_left;
  return;
}

Assistant:

void jpeg_decoder::find_eoi() {
  if (!m_progressive_flag) {
    // Attempt to read the EOI marker.
    //get_bits_no_markers(m_bits_left & 7);

    // Prime the bit buffer
    m_bits_left = 16;
    get_bits(16);
    get_bits(16);

    // The next marker _should_ be EOI
    process_markers();
  }

  m_total_bytes_read -= m_in_buf_left;
}